

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void new_localvar(LexState *ls,TString *name)

{
  FuncState *fs_00;
  Dyndata *pDVar1;
  Proto *o;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  LocVar *pLVar4;
  Vardesc *block;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  LocVar *pLVar9;
  short sVar10;
  ulong uVar11;
  FuncState *fs;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  fs_00 = ls->fs;
  pDVar1 = ls->dyd;
  o = fs_00->f;
  iVar6 = o->sizelocvars;
  if (fs_00->nlocvars < iVar6) {
    pLVar4 = o->locvars;
  }
  else {
    pLVar4 = (LocVar *)luaM_growaux_(ls->L,o->locvars,&o->sizelocvars,0x10,0x7fff,"local variables")
    ;
    o->locvars = pLVar4;
    auVar3 = _DAT_00160820;
    auVar2 = _DAT_00160810;
    if (iVar6 < o->sizelocvars) {
      lVar7 = (long)o->sizelocvars - (long)iVar6;
      lVar8 = lVar7 + -1;
      auVar12._8_4_ = (int)lVar8;
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
      pLVar9 = pLVar4 + (long)iVar6 + 1;
      uVar11 = 0;
      auVar12 = auVar12 ^ _DAT_00160820;
      do {
        auVar13._8_4_ = (int)uVar11;
        auVar13._0_8_ = uVar11;
        auVar13._12_4_ = (int)(uVar11 >> 0x20);
        auVar13 = (auVar13 | auVar2) ^ auVar3;
        if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                    auVar12._4_4_ < auVar13._4_4_) & 1)) {
          pLVar9[-1].varname = (TString *)0x0;
        }
        if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
            auVar13._12_4_ <= auVar12._12_4_) {
          pLVar9->varname = (TString *)0x0;
        }
        uVar11 = uVar11 + 2;
        pLVar9 = pLVar9 + 2;
      } while ((lVar7 + 1U & 0xfffffffffffffffe) != uVar11);
    }
  }
  sVar10 = fs_00->nlocvars;
  pLVar4[sVar10].varname = name;
  if (((o->marked & 4) != 0) && ((name->marked & 3) != 0)) {
    luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)name);
    sVar10 = fs_00->nlocvars;
  }
  fs_00->nlocvars = sVar10 + 1;
  iVar5 = (pDVar1->actvar).n;
  iVar6 = iVar5 + 1;
  if (iVar6 - fs_00->firstlocal < 0xc9) {
    block = (pDVar1->actvar).arr;
    if ((pDVar1->actvar).size < iVar5 + 2) {
      block = (Vardesc *)
              luaM_growaux_(ls->L,block,&(pDVar1->actvar).size,2,0x7fffffff,"local variables");
      (pDVar1->actvar).arr = block;
      iVar5 = (pDVar1->actvar).n;
      iVar6 = iVar5 + 1;
    }
    (pDVar1->actvar).n = iVar6;
    block[iVar5].idx = sVar10;
    return;
  }
  errorlimit(fs_00,200,"local variables");
}

Assistant:

static int new_localvar (LexState *ls, TString *name) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  Vardesc *var;
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                 MAXVARS, "local variables");
  luaM_growvector(L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, USHRT_MAX, "local variables");
  var = &dyd->actvar.arr[dyd->actvar.n++];
  var->vd.kind = VDKREG;  /* default */
  var->vd.name = name;
  return dyd->actvar.n - 1 - fs->firstlocal;
}